

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

AssertionResult
testing::internal::CmpHelperEQ<double,int>
          (char *expected_expression,char *actual_expression,double *expected,int *actual)

{
  double *in_RCX;
  String *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  undefined8 in_RDI;
  double *in_R8;
  AssertionResult AVar2;
  String *unaff_retaddr;
  String *in_stack_00000008;
  char *in_stack_00000010;
  char *in_stack_00000018;
  double *in_stack_ffffffffffffffd0;
  undefined8 uVar3;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar1
  ;
  undefined1 ignoring_case;
  
  if ((*in_RCX != (double)*(int *)in_R8) || (NAN(*in_RCX) || NAN((double)*(int *)in_R8))) {
    uVar3 = in_RDI;
    FormatForComparisonFailureMessage<double,int>(in_R8,(int *)in_stack_ffffffffffffffd0);
    ignoring_case = (undefined1)((ulong)uVar3 >> 0x38);
    FormatForComparisonFailureMessage<int,double>((int *)in_R8,in_stack_ffffffffffffffd0);
    EqFailure(in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr,
              (bool)ignoring_case);
    String::~String(in_RDX);
    String::~String(in_RDX);
    sVar1.ptr_ = extraout_RDX;
  }
  else {
    AVar2 = AssertionSuccess();
    sVar1 = AVar2.message_.ptr_;
  }
  AVar2.message_.ptr_ = sVar1.ptr_;
  AVar2._0_8_ = in_RDI;
  return AVar2;
}

Assistant:

AssertionResult CmpHelperEQ(const char* expected_expression,
                            const char* actual_expression,
                            const T1& expected,
                            const T2& actual) {
#ifdef _MSC_VER
# pragma warning(push)          // Saves the current warning state.
# pragma warning(disable:4389)  // Temporarily disables warning on
                               // signed/unsigned mismatch.
#endif

  if (expected == actual) {
    return AssertionSuccess();
  }

#ifdef _MSC_VER
# pragma warning(pop)          // Restores the warning state.
#endif

  return EqFailure(expected_expression,
                   actual_expression,
                   FormatForComparisonFailureMessage(expected, actual),
                   FormatForComparisonFailureMessage(actual, expected),
                   false);
}